

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.cpp
# Opt level: O1

void __thiscall
acto::actor::consume_package
          (actor *this,unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *p)

{
  long *plVar1;
  msg_t *pmVar2;
  iterator iVar3;
  
  iVar3 = std::
          _Hashtable<std::type_index,_std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_std::allocator<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->handlers_)._M_h,
                 &((p->_M_t).
                   super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>
                   .super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl)->type);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    plVar1 = *(long **)((long)iVar3.
                              super__Node_iterator_base<std::pair<const_std::type_index,_std::unique_ptr<acto::actor::handler_t,_std::default_delete<acto::actor::handler_t>_>_>,_false>
                              ._M_cur + 0x10);
    pmVar2 = (p->_M_t).
             super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>._M_t.
             super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
             super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl;
    (p->_M_t).super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>._M_t
    .super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
    super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl = (msg_t *)0x0;
    (**(code **)(*plVar1 + 0x10))();
    if (pmVar2 != (msg_t *)0x0) {
      (*pmVar2->_vptr_msg_t[1])();
    }
  }
  return;
}

Assistant:

void actor::consume_package(std::unique_ptr<core::msg_t> p) {
  const auto hi = handlers_.find(p->type);
  if (hi != handlers_.end()) {
    hi->second->invoke(std::move(p));
  }
}